

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O2

char * itochr(int i)

{
  CharBuff *buff;
  char *s;
  ulong uVar1;
  
  if (i == 0) {
    s = "0";
  }
  else {
    uVar1 = (ulong)(uint)-i;
    if (0 < i) {
      uVar1 = (ulong)(uint)i;
    }
    buff = new_buff(10);
    for (; (int)uVar1 != 0; uVar1 = uVar1 / 10) {
      sbuff_write(buff,(byte)(uVar1 % 10) | 0x30);
    }
    if (i < 0) {
      sbuff_write(buff,'-');
    }
    s = to_string(buff);
    free(buff->body);
    free(buff);
    reverse(s);
  }
  return s;
}

Assistant:

char *itochr(int i) {
    int num = abs(i);
    if (num == 0) return "0";
    CharBuff *buff = new_buff(10);
    int n;
    while (num > 0) {
        n = num % 10;
        append_chr(buff, (char) (n + '0'));
        num /= 10;
    }
    if (i < 0) {
        append_chr(buff, '-');
    }
    char *value = to_string(buff);
    free(buff->body);
    free(buff);
    return reverse(value);
}